

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChObject.h
# Opt level: O2

shared_ptr<chrono::ChShaft> __thiscall
chrono::
ChContainerSearchFromName<std::shared_ptr<chrono::ChShaft>,__gnu_cxx::__normal_iterator<std::shared_ptr<chrono::ChShaft>*,std::vector<std::shared_ptr<chrono::ChShaft>,std::allocator<std::shared_ptr<chrono::ChShaft>>>>>
          (chrono *this,char *m_name,
          __normal_iterator<std::shared_ptr<chrono::ChShaft>_*,_std::vector<std::shared_ptr<chrono::ChShaft>,_std::allocator<std::shared_ptr<chrono::ChShaft>_>_>_>
          from,__normal_iterator<std::shared_ptr<chrono::ChShaft>_*,_std::vector<std::shared_ptr<chrono::ChShaft>,_std::allocator<std::shared_ptr<chrono::ChShaft>_>_>_>
               to)

{
  int iVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __normal_iterator<std::shared_ptr<chrono::ChShaft>_*,_std::vector<std::shared_ptr<chrono::ChShaft>,_std::allocator<std::shared_ptr<chrono::ChShaft>_>_>_>
  _Var2;
  shared_ptr<chrono::ChShaft> sVar3;
  
  _Var2._M_current = from._M_current;
  do {
    if (_Var2._M_current == to._M_current) {
      *(undefined8 *)this = 0;
      *(undefined8 *)(this + 8) = 0;
LAB_00a8aac0:
      sVar3.super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)from._M_current;
      sVar3.super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)this;
      return (shared_ptr<chrono::ChShaft>)
             sVar3.super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>;
    }
    iVar1 = strcmp(m_name,((((_Var2._M_current)->
                            super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                          ->super_ChPhysicsItem).super_ChObj.m_name._M_dataplus._M_p);
    if (iVar1 == 0) {
      std::__shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2> *)this,
                 &(_Var2._M_current)->
                  super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>);
      from._M_current = (shared_ptr<chrono::ChShaft> *)extraout_RDX_00;
      goto LAB_00a8aac0;
    }
    _Var2._M_current =
         (shared_ptr<chrono::ChShaft> *)
         (&(_Var2._M_current)->super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2> + 1);
    from._M_current = (shared_ptr<chrono::ChShaft> *)extraout_RDX;
  } while( true );
}

Assistant:

T ChContainerSearchFromName(const char* m_name, Iterator from, Iterator to) {
    Iterator iter = from;
    while (iter != to) {
        if (!strcmp(m_name, (*iter)->GetName()))
            return (*iter);
        iter++;
    }
    return T(0);
}